

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radio.cpp
# Opt level: O3

void __thiscall zmq::radio_t::xpipe_terminated(radio_t *this,pipe_t *pipe_)

{
  _Rb_tree_header *p_Var1;
  pipe_t **pppVar2;
  iterator __position;
  __normal_iterator<zmq::pipe_t_**,_std::vector<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>_>
  __dest;
  pipe_t **pppVar3;
  pipe_t *local_28;
  
  __position._M_node = (this->_subscriptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->_subscriptions)._M_t._M_impl.super__Rb_tree_header;
  local_28 = pipe_;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    do {
      if (*(pipe_t **)(__position._M_node + 2) == pipe_) {
        __position = std::
                     _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,zmq::pipe_t*>,std::_Select1st<std::pair<std::__cxx11::string_const,zmq::pipe_t*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,zmq::pipe_t*>>>
                     ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,zmq::pipe_t*>,std::_Select1st<std::pair<std::__cxx11::string_const,zmq::pipe_t*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,zmq::pipe_t*>>>
                                         *)&this->_subscriptions,__position);
      }
      else {
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
    } while ((_Rb_tree_header *)__position._M_node != p_Var1);
  }
  pppVar2 = (this->_udp_pipes).super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<zmq::pipe_t**,std::vector<zmq::pipe_t*,std::allocator<zmq::pipe_t*>>>,__gnu_cxx::__ops::_Iter_equals_val<zmq::pipe_t*const>>
                     ((this->_udp_pipes).
                      super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl.
                      super__Vector_impl_data._M_start,pppVar2,&local_28);
  if (__dest._M_current != pppVar2) {
    pppVar2 = __dest._M_current + 1;
    pppVar3 = (this->_udp_pipes).super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (pppVar2 != pppVar3) {
      memmove(__dest._M_current,pppVar2,(long)pppVar3 - (long)pppVar2);
      pppVar3 = (this->_udp_pipes).super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    (this->_udp_pipes).super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl.
    super__Vector_impl_data._M_finish = pppVar3 + -1;
  }
  dist_t::pipe_terminated(&this->_dist,local_28);
  return;
}

Assistant:

void zmq::radio_t::xpipe_terminated (pipe_t *pipe_)
{
    for (subscriptions_t::iterator it = _subscriptions.begin (),
                                   end = _subscriptions.end ();
         it != end;) {
        if (it->second == pipe_) {
#if __cplusplus >= 201103L || (defined _MSC_VER && _MSC_VER >= 1700)
            it = _subscriptions.erase (it);
#else
            _subscriptions.erase (it++);
#endif
        } else {
            ++it;
        }
    }

    {
        const udp_pipes_t::iterator end = _udp_pipes.end ();
        const udp_pipes_t::iterator it =
          std::find (_udp_pipes.begin (), end, pipe_);
        if (it != end)
            _udp_pipes.erase (it);
    }

    _dist.pipe_terminated (pipe_);
}